

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O3

void __thiscall
TasGrid::GridLocalPolynomial::walkTree<3>
          (GridLocalPolynomial *this,MultiIndexSet *work,double *x,
          vector<int,_std::allocator<int>_> *sindx,vector<double,_std::allocator<double>_> *svals,
          double *y)

{
  switch(this->effective_rule) {
  case pwc:
    walkTree<3,(TasGrid::RuleLocal::erule)0>(this,work,x,sindx,svals,y);
    return;
  case localp:
    walkTree<3,(TasGrid::RuleLocal::erule)1>(this,work,x,sindx,svals,y);
    return;
  case semilocalp:
    walkTree<3,(TasGrid::RuleLocal::erule)2>(this,work,x,sindx,svals,y);
    return;
  case localp0:
    walkTree<3,(TasGrid::RuleLocal::erule)3>(this,work,x,sindx,svals,y);
    return;
  default:
    walkTree<3,(TasGrid::RuleLocal::erule)4>(this,work,x,sindx,svals,y);
    return;
  }
}

Assistant:

void walkTree(const MultiIndexSet &work, const double x[], std::vector<int> &sindx, std::vector<double> &svals, double *y) const{
        switch(effective_rule) {
            case RuleLocal::erule::pwc:
                walkTree<mode, RuleLocal::erule::pwc>(work,x, sindx, svals, y);
                break;
            case RuleLocal::erule::localp:
                walkTree<mode, RuleLocal::erule::localp>(work,x, sindx, svals, y);
                break;
            case RuleLocal::erule::semilocalp:
                walkTree<mode, RuleLocal::erule::semilocalp>(work,x, sindx, svals, y);
                break;
            case RuleLocal::erule::localp0:
                walkTree<mode, RuleLocal::erule::localp0>(work,x, sindx, svals, y);
                break;
            default: // case RuleLocal::erule::localpb:
                walkTree<mode, RuleLocal::erule::localpb>(work,x, sindx, svals, y);
                break;
        };
    }